

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  bool bVar1;
  Value *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  ostream *poVar2;
  string local_c0 [20];
  CommentPlacement in_stack_ffffffffffffff54;
  Value *in_stack_ffffffffffffff58;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  Value *local_10;
  
  local_10 = in_RSI;
  bVar1 = Value::hasComment(in_RSI,commentAfterOnSameLine);
  if (bVar1) {
    poVar2 = *(ostream **)(in_RDI + 0x18);
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    normalizeEOL(in_stack_ffffffffffffff68);
    std::operator+((char *)poVar2,in_stack_ffffffffffffff20);
    std::operator<<(poVar2,local_30);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
  }
  bVar1 = Value::hasComment(local_10,commentAfter);
  if (bVar1) {
    std::operator<<(*(ostream **)(in_RDI + 0x18),"\n");
    poVar2 = *(ostream **)(in_RDI + 0x18);
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    normalizeEOL(in_stack_ffffffffffffff68);
    std::operator<<(poVar2,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::operator<<(*(ostream **)(in_RDI + 0x18),"\n");
  }
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << " " + normalizeEOL(root.getComment(commentAfterOnSameLine));

  if (root.hasComment(commentAfter)) {
    *document_ << "\n";
    *document_ << normalizeEOL(root.getComment(commentAfter));
    *document_ << "\n";
  }
}